

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest3::executeTest
          (NegativeTest3 *this,_shader_stage *shader_stage)

{
  code *pcVar1;
  int iVar2;
  GLenum GVar3;
  GLuint GVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  char *local_288;
  MessageBuilder local_280;
  int local_fc;
  undefined1 local_f8 [4];
  GLint compile_status;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  undefined8 local_48;
  char *body_raw_ptr;
  string body;
  Functions *gl;
  _shader_stage *shader_stage_local;
  NegativeTest3 *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  body.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(body.field_2._8_8_ + 0x3f0);
  GVar3 = Utils::getGLenumForShaderStage(shader_stage);
  GVar4 = (*pcVar1)(GVar3);
  this->m_so_id = GVar4;
  dVar5 = (**(code **)(body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2cd9);
  std::__cxx11::string::string((string *)&body_raw_ptr);
  local_48 = 0;
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
    getVertexShaderBody_abi_cxx11_(&local_68,this);
    std::__cxx11::string::operator=((string *)&body_raw_ptr,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    getTessellationControlShaderBody_abi_cxx11_(&local_98,this);
    std::__cxx11::string::operator=((string *)&body_raw_ptr,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    getTessellationEvaluationShaderBody_abi_cxx11_(&local_b8,this);
    std::__cxx11::string::operator=((string *)&body_raw_ptr,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  case SHADER_STAGE_GEOMETRY:
    getGeometryShaderBody_abi_cxx11_(&local_d8,this);
    std::__cxx11::string::operator=((string *)&body_raw_ptr,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  case SHADER_STAGE_FRAGMENT:
    getFragmentShaderBody_abi_cxx11_((string *)local_f8,this);
    std::__cxx11::string::operator=((string *)&body_raw_ptr,(string *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader stage requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2cf3);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_48 = std::__cxx11::string::c_str();
  (**(code **)(body.field_2._8_8_ + 0x12b8))(this->m_so_id,1,&local_48,0);
  dVar5 = (**(code **)(body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2cfa);
  local_fc = 0;
  (**(code **)(body.field_2._8_8_ + 0x248))(this->m_so_id);
  dVar5 = (**(code **)(body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d00);
  (**(code **)(body.field_2._8_8_ + 0xa70))(this->m_so_id,0x8b81,&local_fc);
  dVar5 = (**(code **)(body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d03);
  if (local_fc == 1) {
    this_01 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_280,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_280,
                        (char (*) [89])
                        "The following shader was expected to fail to compile but was accepted by the compiler:\n\n"
                       );
    local_288 = (char *)std::__cxx11::string::c_str();
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_288);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_280);
    this->m_has_test_passed = false;
  }
  (**(code **)(body.field_2._8_8_ + 0x470))(this->m_so_id);
  dVar5 = (**(code **)(body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"glDeleteShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d11);
  std::__cxx11::string::~string((string *)&body_raw_ptr);
  return;
}

Assistant:

void NegativeTest3::executeTest(const Utils::_shader_stage& shader_stage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a new shader object */
	m_so_id = gl.createShader(Utils::getGLenumForShaderStage(shader_stage));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Assign body to the shader */
	std::string body;
	const char* body_raw_ptr = DE_NULL;

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_VERTEX:
		body = getVertexShaderBody();
		break;
	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
		body = getTessellationControlShaderBody();
		break;
	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
		body = getTessellationEvaluationShaderBody();
		break;
	case Utils::SHADER_STAGE_GEOMETRY:
		body = getGeometryShaderBody();
		break;
	case Utils::SHADER_STAGE_FRAGMENT:
		body = getFragmentShaderBody();
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader stage requested");
	}
	} /* switch (shader_stage) */

	body_raw_ptr = body.c_str();

	gl.shaderSource(m_so_id, 1 /* count */, &body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Try to compile the shader */
	glw::GLint compile_status = 0;

	gl.compileShader(m_so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_so_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "The following shader was expected to fail to compile but was "
													   "accepted by the compiler:\n"
													   "\n"
						   << body.c_str() << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* Good to release the shader at this point */
	gl.deleteShader(m_so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
}